

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitMethodFld(ParseNode *pnode,RegSlot callObjLocation,PropertyId propertyId,
                  ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  bool registerCacheIdForCall)

{
  uint32 uVar1;
  ParseNodeName *pPVar2;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool isScoped;
  bool isRoot;
  bool registerCacheIdForCall_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  PropertyId propertyId_local;
  RegSlot callObjLocation_local;
  ParseNode *pnode_local;
  
  local_2c = false;
  if (pnode->nop == knopName) {
    pPVar2 = ParseNode::AsParseNodeName(pnode);
    local_2d = true;
    if (pPVar2->sym != (Symbol *)0x0) {
      pPVar2 = ParseNode::AsParseNodeName(pnode);
      local_2d = Symbol::GetIsGlobal(pPVar2->sym);
    }
    local_2c = local_2d;
  }
  uVar1 = ByteCodeGenerator::GetFlags(byteCodeGenerator);
  local_2e = true;
  if ((uVar1 & 0x400) == 0) {
    local_2f = local_2c != false && callObjLocation != 0xfffffffd;
    local_2e = local_2f;
  }
  EmitMethodFld(local_2c,local_2e,pnode->location,callObjLocation,propertyId,byteCodeGenerator,
                funcInfo,registerCacheIdForCall);
  return;
}

Assistant:

void EmitMethodFld(ParseNode *pnode, Js::RegSlot callObjLocation, Js::PropertyId propertyId, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, bool registerCacheIdForCall = true)
{
    // Load a call target of the form x.y(). (Call target may be a plain knopName if we're getting it from
    // the global object, etc.)
    bool isRoot = pnode->nop == knopName && (pnode->AsParseNodeName()->sym == nullptr || pnode->AsParseNodeName()->sym->GetIsGlobal());
    bool isScoped = (byteCodeGenerator->GetFlags() & fscrEval) != 0 ||
        (isRoot && callObjLocation != ByteCodeGenerator::RootObjectRegister);

    EmitMethodFld(isRoot, isScoped, pnode->location, callObjLocation, propertyId, byteCodeGenerator, funcInfo, registerCacheIdForCall);
}